

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_serializer.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> *
net_serializer<std::vector<double,_std::allocator<double>_>,_void>::deserialize
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,istream *in)

{
  bool bVar1;
  size_type __n;
  reference pdVar2;
  double dVar3;
  double *i;
  iterator __end0;
  iterator __begin0;
  vector<double,_std::allocator<double>_> *__range2;
  allocator<double> local_1e;
  undefined1 local_1d;
  int local_1c;
  istream *piStack_18;
  int size;
  istream *in_local;
  vector<double,_std::allocator<double>_> *data;
  
  piStack_18 = in;
  in_local = (istream *)__return_storage_ptr__;
  local_1c = net_serializer<int,_void>::deserialize(in);
  local_1d = 0;
  __n = (size_type)local_1c;
  std::allocator<double>::allocator(&local_1e);
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,__n,&local_1e);
  std::allocator<double>::~allocator(&local_1e);
  __end0 = std::vector<double,_std::allocator<double>_>::begin(__return_storage_ptr__);
  i = (double *)std::vector<double,_std::allocator<double>_>::end(__return_storage_ptr__);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                     *)&i), bVar1) {
    pdVar2 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&__end0);
    dVar3 = net_serializer<double,_void>::deserialize(piStack_18);
    *pdVar2 = dVar3;
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end0);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<T> deserialize(std::istream& in){
        int size = net_serializer<int>::deserialize(in);
        std::vector<T> data(size);
        for (auto& i:data)
            i = net_serializer<T>::deserialize(in);
        return data;
    }